

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScannerResolver.cpp
# Opt level: O0

XMLScanner *
xercesc_4_0::XMLScannerResolver::resolveScanner
          (XMLCh *scannerName,XMLValidator *valToAdopt,GrammarResolver *grammarResolver,
          MemoryManager *manager)

{
  bool bVar1;
  MemoryManager *manager_local;
  GrammarResolver *grammarResolver_local;
  XMLValidator *valToAdopt_local;
  XMLCh *scannerName_local;
  
  bVar1 = XMLString::equals(scannerName,(XMLCh *)XMLUni::fgWFXMLScanner);
  if (bVar1) {
    scannerName_local = (XMLCh *)XMemory::operator_new(0x3d0,manager);
    WFXMLScanner::WFXMLScanner((WFXMLScanner *)scannerName_local,valToAdopt,grammarResolver,manager)
    ;
  }
  else {
    bVar1 = XMLString::equals(scannerName,(XMLCh *)XMLUni::fgIGXMLScanner);
    if (bVar1) {
      scannerName_local = (XMLCh *)XMemory::operator_new(0x4b8,manager);
      IGXMLScanner::IGXMLScanner
                ((IGXMLScanner *)scannerName_local,valToAdopt,grammarResolver,manager);
    }
    else {
      bVar1 = XMLString::equals(scannerName,(XMLCh *)XMLUni::fgSGXMLScanner);
      if (bVar1) {
        scannerName_local = (XMLCh *)XMemory::operator_new(0x4a8,manager);
        SGXMLScanner::SGXMLScanner
                  ((SGXMLScanner *)scannerName_local,valToAdopt,grammarResolver,manager);
      }
      else {
        bVar1 = XMLString::equals(scannerName,(XMLCh *)XMLUni::fgDGXMLScanner);
        if (bVar1) {
          scannerName_local = (XMLCh *)XMemory::operator_new(0x3d8,manager);
          DGXMLScanner::DGXMLScanner
                    ((DGXMLScanner *)scannerName_local,valToAdopt,grammarResolver,manager);
        }
        else {
          scannerName_local = (XMLCh *)0x0;
        }
      }
    }
  }
  return (XMLScanner *)scannerName_local;
}

Assistant:

XMLScanner*
XMLScannerResolver::resolveScanner( const XMLCh* const   scannerName
                                  , XMLValidator* const  valToAdopt
                                  , GrammarResolver* const grammarResolver
                                  , MemoryManager* const manager)
{
    if (XMLString::equals(scannerName, XMLUni::fgWFXMLScanner))
        return new (manager) WFXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgIGXMLScanner))
        return new (manager) IGXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgSGXMLScanner))
        return new (manager) SGXMLScanner(valToAdopt, grammarResolver, manager);
    else if (XMLString::equals(scannerName, XMLUni::fgDGXMLScanner))
        return new (manager) DGXMLScanner(valToAdopt, grammarResolver, manager);

    // REVISIT: throw an exception or return a default one?
    return 0;
}